

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O0

SyntaxPrinter * __thiscall
slang::syntax::SyntaxPrinter::append(SyntaxPrinter *this,string_view text)

{
  bool bVar1;
  bool bVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference pvVar5;
  char *in_RDX;
  size_t in_RSI;
  SyntaxPrinter *in_RDI;
  bool bVar6;
  size_t i;
  bool newline;
  bool carriage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> *__svt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__pos;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  if ((in_RDI->squashNewlines & 1U) == 0) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffffd0,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0._M_str)
    ;
    return in_RDI;
  }
  bVar6 = false;
  bVar1 = false;
  local_18._M_len = in_RSI;
  local_18._M_str = in_RDX;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  if ((!bVar2) &&
     ((pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0),
      *pvVar3 == '\r' ||
      (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0),
      *pvVar3 == '\n')))) {
    in_stack_ffffffffffffffb0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_18,0);
    bVar6 = *pvVar3 == '\r';
    if (bVar6) {
      in_stack_ffffffffffffffb0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&(in_stack_ffffffffffffffb0->_M_dataplus)._M_p + 1);
    }
    __pos = in_stack_ffffffffffffffb0;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
    if ((in_stack_ffffffffffffffb0 < pbVar4) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (&local_18,(size_type)__pos), *pvVar3 == '\n')) {
      bVar1 = true;
      __pos = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(__pos->_M_dataplus)._M_p + 1);
    }
    while (in_stack_ffffffffffffffd0 = __pos,
          pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18),
          __pos < pbVar4) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_18,(size_type)in_stack_ffffffffffffffd0);
      if ((*pvVar3 == '\r') ||
         (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&local_18,(size_type)in_stack_ffffffffffffffd0), *pvVar3 == '\n')) {
        in_stack_ffffffffffffffd0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&(in_stack_ffffffffffffffd0->_M_dataplus)._M_p + 1);
      }
      __pos = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&(in_stack_ffffffffffffffd0->_M_dataplus)._M_p + 1);
    }
    in_stack_ffffffffffffffc0 =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
                    (size_type)in_stack_ffffffffffffffc0._M_str,in_stack_ffffffffffffffc0._M_len);
    local_18._M_len = in_stack_ffffffffffffffc0._M_len;
    local_18._M_str = in_stack_ffffffffffffffc0._M_str;
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xca08f8);
  if (!bVar2) {
    pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                       (in_stack_ffffffffffffffb0);
    __svt = (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0._M_str;
    if (*pvVar5 == '\n') goto LAB_00ca093c;
  }
  if (bVar6) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffc0._M_len,(char)((ulong)in_RDI >> 0x38));
  }
  __svt = (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0._M_str;
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffc0._M_len,(char)((ulong)in_RDI >> 0x38));
  }
LAB_00ca093c:
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            (in_stack_ffffffffffffffd0,__svt);
  return in_RDI;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::append(std::string_view text) {
    if (!squashNewlines) {
        buffer.append(text);
        return *this;
    }

    bool carriage = false;
    bool newline = false;

    if (!text.empty() && (text[0] == '\r' || text[0] == '\n')) {
        size_t i = 0;
        if (text[i] == '\r') {
            carriage = true;
            i++;
        }

        if (i < text.length() && text[i] == '\n') {
            newline = true;
            i++;
        }

        for (; i < text.length(); i++) {
            if (text[i] == '\r' || text[i] == '\n')
                i++;
        }

        text = text.substr(i);
    }

    if (buffer.empty() || buffer.back() != '\n') {
        if (carriage)
            buffer.push_back('\r');
        if (newline)
            buffer.push_back('\n');
    }

    buffer.append(text);
    return *this;
}